

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall
xray_re::xr_ogf_v3::partition_io::import
          (partition_io *this,xr_reader *r,xr_bone_vec *all_bones,int version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort *puVar2;
  uint *puVar3;
  __type _Var4;
  reference ppxVar5;
  ulong uVar6;
  bool bVar7;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  xr_reader::r_sz(r,&(this->super_xr_partition).m_name);
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar6 = (ulong)*puVar2;
  paVar1 = &local_50.field_2;
  do {
    bVar7 = uVar6 == 0;
    uVar6 = uVar6 - 1;
    if (bVar7) {
      return;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    if (version == 3) {
      xr_reader::r_sz(r,&local_50);
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      ppxVar5 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                          (all_bones,(ulong)*puVar3);
      _Var4 = std::operator==(&(*ppxVar5)->m_name,&local_50);
      if (!_Var4) {
        __assert_fail("all_bones.at(r.r_u32())->name() == name",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x150,
                      "void xray_re::xr_ogf_v3::partition_io::import(xr_reader &, xr_bone_vec &, int)"
                     );
      }
    }
    else if (version == 2) {
      xr_reader::r_sz(r,&local_50);
    }
    else if (version == 1) {
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                (all_bones,(ulong)*puVar3);
      std::__cxx11::string::_M_assign((string *)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_xr_partition).m_bones,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  } while( true );
}

Assistant:

inline void xr_ogf_v3::partition_io::import(xr_reader& r, xr_bone_vec& all_bones, int version)
{
	r.r_sz(m_name);
	for (uint_fast32_t n = r.r_u16(); n; --n)
	{
		std::string name;
		switch (version)
		{
		case 1:
			name =  all_bones.at(r.r_u32())->name();
			break;
		case 2:
			r.r_sz(name);
			break;
		case 3:
			r.r_sz(name);
			xr_assert(all_bones.at(r.r_u32())->name() == name);
		}
		m_bones.push_back(name);
	}
}